

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O2

int __thiscall
dit::anon_unknown_0::CommonFrameworkTests::init(CommonFrameworkTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SelfCheckCase *pSVar1;
  
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float_format",
             "tcu::FloatFormat_selfTest()",tcu::FloatFormat_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"either",
             "tcu::Either_selfTest()",tcu::Either_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "float_format","tcu::FloatFormat_selfTest()",
								   tcu::FloatFormat_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "either","tcu::Either_selfTest()",
								   tcu::Either_selfTest));
	}